

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::Symbol::IsVisibleFrom(Symbol *this,FileDescriptor *other)

{
  bool bVar1;
  SymbolVisibility SVar2;
  FileDescriptor *pFVar3;
  SymbolVisibility effective_visibility;
  FileDescriptor *other_local;
  Symbol *this_local;
  
  pFVar3 = GetFile(this);
  if ((pFVar3 == (FileDescriptor *)0x0) || (other == (FileDescriptor *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = IsType(this);
    if (bVar1) {
      bVar1 = is_placeholder(this);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        pFVar3 = GetFile(this);
        if (pFVar3 == other) {
          this_local._7_1_ = true;
        }
        else {
          SVar2 = GetEffectiveVisibility(this);
          this_local._7_1_ = SVar2 == VISIBILITY_EXPORT;
        }
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool IsVisibleFrom(FileDescriptor* other) const {
    if (GetFile() == nullptr || other == nullptr) {
      return false;
    }

    // Only Types (message/enum) have visibility.
    if (!IsType()) {
      return true;
    }

    // If we're dealing with a placeholder then just stop now, visibility can't
    // be determined and we have to rely on the proto-compiler previously having
    // checked the validity.
    if (is_placeholder()) {
      return true;
    }

    if (GetFile() == other) {
      return true;
    }

    SymbolVisibility effective_visibility = GetEffectiveVisibility();

    return effective_visibility == SymbolVisibility::VISIBILITY_EXPORT;
  }